

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O0

void __thiscall FNodeBuilder::RemoveSegFromVert1(FNodeBuilder *this,DWORD segnum,int vertnum)

{
  DWORD DVar1;
  FPrivVert *pFVar2;
  FPrivSeg *pFVar3;
  uint local_28;
  uint local_24;
  DWORD curr;
  DWORD prev;
  FPrivVert *v;
  int vertnum_local;
  DWORD segnum_local;
  FNodeBuilder *this_local;
  
  pFVar2 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)vertnum);
  if (pFVar2->segs == segnum) {
    pFVar3 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)segnum);
    pFVar2->segs = pFVar3->nextforvert;
  }
  else {
    local_24 = 0;
    local_28 = pFVar2->segs;
    while (local_28 != 0xffffffff && local_28 != segnum) {
      local_24 = local_28;
      pFVar3 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)local_28);
      local_28 = pFVar3->nextforvert;
    }
    if (local_28 == segnum) {
      pFVar3 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)local_28);
      DVar1 = pFVar3->nextforvert;
      pFVar3 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)local_24);
      pFVar3->nextforvert = DVar1;
    }
  }
  return;
}

Assistant:

void FNodeBuilder::RemoveSegFromVert1 (DWORD segnum, int vertnum)
{
	FPrivVert *v = &Vertices[vertnum];

	if (v->segs == segnum)
	{
		v->segs = Segs[segnum].nextforvert;
	}
	else
	{
		DWORD prev, curr;
		prev = 0;
		curr = v->segs;
		while (curr != DWORD_MAX && curr != segnum)
		{
			prev = curr;
			curr = Segs[curr].nextforvert;
		}
		if (curr == segnum)
		{
			Segs[prev].nextforvert = Segs[curr].nextforvert;
		}
	}
}